

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashtbl.c
# Opt level: O1

void * tommy_hashtable_remove
                 (tommy_hashtable *hashtable,undefined1 *cmp,void *cmp_arg,tommy_hash_t hash)

{
  long lVar1;
  tommy_hashtable_node *ptVar2;
  tommy_hashtable_node **pptVar3;
  tommy_hashtable_node *ptVar4;
  tommy_hashtable_node *ptVar5;
  int iVar6;
  void *pvVar7;
  tommy_node_struct *ptVar8;
  tommy_hashtable_node *ptVar9;
  uint uVar10;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = hashtable->bucket_mask & hash;
  ptVar2 = hashtable->bucket[uVar10];
  do {
    if (ptVar2 == (tommy_hashtable_node *)0x0) {
      pvVar7 = (void *)0x0;
LAB_00110a56:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return pvVar7;
      }
      __stack_chk_fail();
    }
    if ((ptVar2->key == hash) && (iVar6 = (*(code *)cmp)(cmp_arg,ptVar2->data), iVar6 == 0)) {
      pptVar3 = hashtable->bucket;
      ptVar4 = pptVar3[uVar10];
      ptVar5 = ptVar2->next;
      ptVar9 = ptVar5;
      if (ptVar5 == (tommy_hashtable_node *)0x0) {
        ptVar9 = ptVar4;
      }
      ptVar9->prev = ptVar2->prev;
      if (ptVar4 == ptVar2) {
        ptVar8 = (tommy_node_struct *)(pptVar3 + uVar10);
      }
      else {
        ptVar8 = ptVar2->prev;
      }
      ptVar8->next = ptVar5;
      hashtable->count = hashtable->count - 1;
      pvVar7 = ptVar2->data;
      goto LAB_00110a56;
    }
    ptVar2 = ptVar2->next;
  } while( true );
}

Assistant:

void* tommy_hashtable_remove(tommy_hashtable* hashtable, tommy_search_func* cmp, const void* cmp_arg, tommy_hash_t hash)
{
	tommy_count_t pos = hash & hashtable->bucket_mask;
	tommy_hashtable_node* node = hashtable->bucket[pos];

	while (node) {
		/* we first check if the hash matches, as in the same bucket we may have multiples hash values */
		if (node->key == hash && cmp(cmp_arg, node->data) == 0) {
			tommy_list_remove_existing(&hashtable->bucket[pos], node);

			--hashtable->count;

			return node->data;
		}
		node = node->next;
	}

	return 0;
}